

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O0

string * phosg::escape_quotes(string *__return_storage_ptr__,string *s)

{
  ulong uVar1;
  size_type sVar2;
  byte *pbVar3;
  string local_60;
  byte local_29;
  ulong uStack_28;
  char ch;
  size_t x;
  string *local_18;
  string *s_local;
  string *ret;
  
  x._7_1_ = 0;
  local_18 = s;
  s_local = __return_storage_ptr__;
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  for (uStack_28 = 0; uVar1 = uStack_28,
      sVar2 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              size(local_18), uVar1 < sVar2; uStack_28 = uStack_28 + 1) {
    pbVar3 = (byte *)::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                               (local_18,uStack_28);
    local_29 = *pbVar3;
    if (local_29 == 0x22) {
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (__return_storage_ptr__,"\\\"");
    }
    else if (((char)local_29 < ' ') || ('~' < (char)local_29)) {
      string_printf_abi_cxx11_(&local_60,"\\x%02X",(ulong)local_29);
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (__return_storage_ptr__,&local_60);
      ::std::__cxx11::string::~string((string *)&local_60);
    }
    else {
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (__return_storage_ptr__,local_29);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string escape_quotes(const string& s) {
  string ret;
  for (size_t x = 0; x < s.size(); x++) {
    char ch = s[x];
    if (ch == '\"') {
      ret += "\\\"";
    } else if (ch < 0x20 || ch > 0x7E) {
      ret += string_printf("\\x%02X", static_cast<uint8_t>(ch));
    } else {
      ret += ch;
    }
  }
  return ret;
}